

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

void Sfm_NtkUpdate(Sfm_Ntk_t *p,int iNode,int f,int iFaninNew,word uTruth)

{
  uint uVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint iFanin;
  long lVar7;
  bool bVar8;
  
  if ((-1 < iNode) && (iNode < (p->vFanins).nSize)) {
    if (-1 < f) {
      pVVar3 = (p->vFanins).pArray;
      uVar1 = pVVar3[(uint)iNode].nSize;
      if (f < (int)uVar1) {
        if ((iNode < p->nPis) || (p->nObjs <= p->nPos + iNode)) {
          __assert_fail("Sfm_ObjIsNode(p, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                        ,0x141,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
        }
        iFanin = pVVar3[(uint)iNode].pArray[(uint)f];
        if (iFanin == iFaninNew) {
          __assert_fail("iFanin != iFaninNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                        ,0x142,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
        }
        if (6 < uVar1) {
          __assert_fail("Sfm_ObjFaninNum(p, iNode) <= 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                        ,0x143,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
        }
        if (uTruth + 1 < 2) {
          pVVar3 = (p->vFanins).pArray;
          if (0 < pVVar3[(uint)iNode].nSize) {
            lVar5 = 0;
            do {
              iFanin = pVVar3[(uint)iNode].pArray[lVar5];
              lVar7 = (long)(int)iFanin;
              if ((lVar7 < 0) || ((p->vFanouts).nSize <= (int)iFanin)) goto LAB_005346f7;
              pVVar3 = (p->vFanouts).pArray;
              iVar4 = pVVar3[lVar7].nSize;
              if ((long)iVar4 < 1) {
                if (iVar4 != 0) {
                  __assert_fail("i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
                }
LAB_0053471a:
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                              ,0x148,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
              }
              piVar2 = pVVar3[lVar7].pArray;
              lVar6 = 1;
              while (piVar2[lVar6 + -1] != iNode) {
                bVar8 = lVar6 == iVar4;
                lVar6 = lVar6 + 1;
                if (bVar8) goto LAB_0053471a;
              }
              if ((int)lVar6 < iVar4) {
                do {
                  piVar2[lVar6 + -1] = piVar2[lVar6];
                  lVar6 = lVar6 + 1;
                  iVar4 = pVVar3[lVar7].nSize;
                } while ((int)lVar6 < iVar4);
              }
              pVVar3[lVar7].nSize = iVar4 + -1;
              Sfm_NtkDeleteObj_rec(p,iFanin);
              if ((p->vFanins).nSize <= iNode) goto LAB_005346f7;
              lVar5 = lVar5 + 1;
              pVVar3 = (p->vFanins).pArray;
            } while (lVar5 < pVVar3[(uint)iNode].nSize);
          }
          pVVar3[(uint)iNode].nSize = 0;
        }
        else {
          Sfm_NtkRemoveFanin(p,iNode,iFanin);
          Sfm_NtkAddFanin(p,iNode,iFaninNew);
          Sfm_NtkDeleteObj_rec(p,iFanin);
        }
        Sfm_NtkUpdateLevel_rec(p,iNode);
        if (iFaninNew != -1) {
          Sfm_NtkUpdateLevelR_rec(p,iFaninNew);
        }
        if ((-1 < (int)iFanin) && ((int)iFanin < (p->vFanouts).nSize)) {
          if (0 < (p->vFanouts).pArray[iFanin].nSize) {
            Sfm_NtkUpdateLevelR_rec(p,iFanin);
          }
          if (p->vTruths->nSize <= iNode) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          p->vTruths->pArray[(uint)iNode] = uTruth;
          if ((iNode < (p->vFanins).nSize) && (iNode < p->vCnfs->nSize)) {
            Sfm_TruthToCnf(uTruth,(word *)0x0,(p->vFanins).pArray[(uint)iNode].nSize,p->vCover,
                           (Vec_Str_t *)(p->vCnfs->pArray + (uint)iNode));
            return;
          }
        }
        goto LAB_005346f7;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_005346f7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Sfm_NtkUpdate( Sfm_Ntk_t * p, int iNode, int f, int iFaninNew, word uTruth )
{
    int iFanin = Sfm_ObjFanin( p, iNode, f );
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( iFanin != iFaninNew );
    assert( Sfm_ObjFaninNum(p, iNode) <= 6 );
    if ( uTruth == 0 || ~uTruth == 0 )
    {
        Sfm_ObjForEachFanin( p, iNode, iFanin, f )
        {
            int RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );  assert( RetValue );
            Sfm_NtkDeleteObj_rec( p, iFanin );
        }
        Vec_IntClear( Sfm_ObjFiArray(p, iNode) );
    }
    else
    {
        // replace old fanin by new fanin
        Sfm_NtkRemoveFanin( p, iNode, iFanin );
        Sfm_NtkAddFanin( p, iNode, iFaninNew );
        // recursively remove MFFC
        Sfm_NtkDeleteObj_rec( p, iFanin );
    }
    // update logic level
    Sfm_NtkUpdateLevel_rec( p, iNode );
    if ( iFaninNew != -1 )
        Sfm_NtkUpdateLevelR_rec( p, iFaninNew );
    if ( Sfm_ObjFanoutNum(p, iFanin) > 0 )
        Sfm_NtkUpdateLevelR_rec( p, iFanin );
    // update truth table
    Vec_WrdWriteEntry( p->vTruths, iNode, uTruth );
    Sfm_TruthToCnf( uTruth, NULL, Sfm_ObjFaninNum(p, iNode), p->vCover, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode) );
}